

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOCommunicationsNode.cpp
# Opt level: O0

void __thiscall DIS::IOCommunicationsNode::IOCommunicationsNode(IOCommunicationsNode *this)

{
  IOCommunicationsNode *this_local;
  
  this->_vptr_IOCommunicationsNode = (_func_int **)&PTR__IOCommunicationsNode_00267f90;
  this->_recordType = 0x157d;
  this->_recordLength = 0x10;
  this->_communcationsNodeType = '\0';
  this->_padding = '\0';
  EntityID::EntityID(&this->_communicationsNode);
  this->_elementID = 0;
  return;
}

Assistant:

IOCommunicationsNode::IOCommunicationsNode():
   _recordType(5501), 
   _recordLength(16), 
   _communcationsNodeType(0), 
   _padding(0), 
   _communicationsNode(), 
   _elementID(0)
{
}